

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O0

GuestArenaAllocator * __thiscall
DListBase<Memory::Recycler::GuestArenaAllocator,RealCount>::
PrependNode<Memory::HeapAllocator,char16_t_const*,Memory::IdleDecommitPageAllocator*,void(*)()>
          (DListBase<Memory::Recycler::GuestArenaAllocator,RealCount> *this,HeapAllocator *allocator
          ,char16_t *param1,IdleDecommitPageAllocator *param2,_func_void *param3)

{
  HeapAllocator *alloc;
  DListNode<Memory::Recycler::GuestArenaAllocator> *this_00;
  DListNodeBase<Memory::Recycler::GuestArenaAllocator> **ppDVar1;
  TrackAllocData local_68;
  DListNode<Memory::Recycler::GuestArenaAllocator> *local_40;
  Node *newNode;
  _func_void *param3_local;
  IdleDecommitPageAllocator *param2_local;
  char16_t *param1_local;
  HeapAllocator *allocator_local;
  DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *this_local;
  
  newNode = (Node *)param3;
  param3_local = (_func_void *)param2;
  param2_local = (IdleDecommitPageAllocator *)param1;
  param1_local = (char16_t *)allocator;
  allocator_local = (HeapAllocator *)this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_68,(type_info *)&DListNode<Memory::Recycler::GuestArenaAllocator>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
             ,0x131);
  alloc = Memory::HeapAllocator::TrackAllocInfo(allocator,&local_68);
  this_00 = (DListNode<Memory::Recycler::GuestArenaAllocator> *)
            new<Memory::HeapAllocator>(0x98,alloc,0x21ca90);
  DListNode<Memory::Recycler::GuestArenaAllocator>::
  DListNode<char16_t_const*,Memory::IdleDecommitPageAllocator*,void(*)()>
            (this_00,(char16_t *)param2_local,(IdleDecommitPageAllocator *)param3_local,
             (_func_void *)newNode);
  if (this_00 == (DListNode<Memory::Recycler::GuestArenaAllocator> *)0x0) {
    this_local = (DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)0x0;
  }
  else {
    local_40 = this_00;
    ppDVar1 = DListNodeBase<Memory::Recycler::GuestArenaAllocator>::Next
                        ((DListNodeBase<Memory::Recycler::GuestArenaAllocator> *)this);
    DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::InsertNodeBefore
              (*ppDVar1,&local_40->super_DListNodeBase<Memory::Recycler::GuestArenaAllocator>);
    RealCount::IncrementCount((RealCount *)(this + 0x10));
    this_local = (DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)&local_40->data;
  }
  return (GuestArenaAllocator *)this_local;
}

Assistant:

TData * PrependNode(TAllocator * allocator, TParam1 param1, TParam2 param2, TParam3 param3)
    {
        Node * newNode = AllocatorNew(TAllocator, allocator, Node, param1, param2, param3);
        if (newNode)
        {
            DListBase::InsertNodeBefore(this->Next(), newNode);
            this->IncrementCount();
            return &newNode->data;
        }
        return nullptr;
    }